

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void cleanup_hints(void)

{
  hint *phVar1;
  hint *p;
  
  p = hints;
  while (p != (hint *)0x0) {
    phVar1 = p->next;
    string_free(p->hint);
    mem_free(p);
    p = phVar1;
  }
  return;
}

Assistant:

static void cleanup_hints(void)
{
	struct hint *h, *next;

	h = hints;
	while(h) {
		next = h->next;
		string_free(h->hint);
		mem_free(h);
		h = next;
	}
}